

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * Catch::StringMaker<unsigned_long_long,void>::convert_abi_cxx11_(unsigned_long_long value)

{
  ReusableStringStream *this;
  ulong in_RSI;
  string *in_RDI;
  ReusableStringStream rss;
  ReusableStringStream *in_stack_ffffffffffffff98;
  ReusableStringStream *in_stack_ffffffffffffffa0;
  ReusableStringStream *in_stack_ffffffffffffffe0;
  
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffa0);
  ReusableStringStream::operator<<(in_stack_ffffffffffffffa0,&in_stack_ffffffffffffff98->m_index);
  if (0xff < in_RSI) {
    ReusableStringStream::operator<<
              (in_stack_ffffffffffffffa0,(char (*) [5])in_stack_ffffffffffffff98);
    ReusableStringStream::operator<<
              (in_stack_ffffffffffffffa0,
               (_func_ios_base_ptr_ios_base_ptr *)in_stack_ffffffffffffff98);
    this = ReusableStringStream::operator<<
                     (in_stack_ffffffffffffffa0,&in_stack_ffffffffffffff98->m_index);
    ReusableStringStream::operator<<(this,(char *)in_stack_ffffffffffffff98);
  }
  ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff98);
  ReusableStringStream::~ReusableStringStream(in_stack_ffffffffffffffe0);
  return in_RDI;
}

Assistant:

std::string StringMaker<unsigned long long>::convert(unsigned long long value) {
    ReusableStringStream rss;
    rss << value;
    if (value > Detail::hexThreshold) {
        rss << " (0x" << std::hex << value << ')';
    }
    return rss.str();
}